

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiSmokeTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_1::createSamplerTest(TestStatus *__return_storage_ptr__,Context *context)

{
  Handle<(vk::HandleType)20> obj;
  VkDevice device;
  DeviceInterface *vk;
  Move<vk::Handle<(vk::HandleType)20>_> tmpSampler;
  VkSamplerCreateInfo samplerInfo;
  Deleter<vk::Handle<(vk::HandleType)20>_> DStack_a0;
  Move<vk::Handle<(vk::HandleType)20>_> local_88;
  VkSamplerCreateInfo local_68;
  
  device = Context::getDevice(context);
  vk = Context::getDeviceInterface(context);
  local_68.pNext = (void *)0x0;
  local_68.minLod = 0.0;
  local_68.maxLod = 0.0;
  local_68.borderColor = VK_BORDER_COLOR_FLOAT_TRANSPARENT_BLACK;
  local_68.unnormalizedCoordinates = 0;
  local_68.flags = 0;
  local_68.magFilter = VK_FILTER_NEAREST;
  local_68.minFilter = VK_FILTER_NEAREST;
  local_68.mipmapMode = VK_SAMPLER_MIPMAP_MODE_NEAREST;
  local_68.sType = VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO;
  local_68._4_4_ = 0;
  local_68.addressModeU = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE;
  local_68.addressModeV = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE;
  local_68.addressModeW = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE;
  local_68.mipLodBias = 0.0;
  local_68.anisotropyEnable = 0;
  local_68.maxAnisotropy = 1.0;
  local_68.compareEnable = 0;
  local_68.compareOp = VK_COMPARE_OP_ALWAYS;
  ::vk::createSampler(&local_88,vk,device,&local_68,(VkAllocationCallbacks *)0x0);
  DStack_a0.m_allocator =
       local_88.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_allocator;
  DStack_a0.m_device =
       local_88.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_device;
  DStack_a0.m_deviceIface =
       local_88.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_deviceIface;
  obj.m_internal = local_88.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.m_internal;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.m_internal = 0;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)20>_>::operator()
              (&DStack_a0,(VkSampler)obj.m_internal);
  }
  if (local_88.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)20>_>::operator()
              (&local_88.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter,
               (VkSampler)
               local_88.super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.m_internal);
  }
  local_68._0_8_ = (void *)((long)&local_68 + 0x10U);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"Creating sampler succeeded","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_68._0_8_,
             (long)local_68.pNext + local_68._0_8_);
  if ((void *)local_68._0_8_ != (void *)((long)&local_68 + 0x10U)) {
    operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSamplerTest (Context& context)
{
	const VkDevice			vkDevice	= context.getDevice();
	const DeviceInterface&	vk			= context.getDeviceInterface();

	{
		const struct VkSamplerCreateInfo		samplerInfo	=
		{
			VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO,		// sType
			DE_NULL,									// pNext
			0u,											// flags
			VK_FILTER_NEAREST,							// magFilter
			VK_FILTER_NEAREST,							// minFilter
			VK_SAMPLER_MIPMAP_MODE_NEAREST,				// mipmapMode
			VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE,		// addressModeU
			VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE,		// addressModeV
			VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE,		// addressModeW
			0.0f,										// mipLodBias
			VK_FALSE,									// anisotropyEnable
			1.0f,										// maxAnisotropy
			DE_FALSE,									// compareEnable
			VK_COMPARE_OP_ALWAYS,						// compareOp
			0.0f,										// minLod
			0.0f,										// maxLod
			VK_BORDER_COLOR_FLOAT_TRANSPARENT_BLACK,	// borderColor
			VK_FALSE,									// unnormalizedCoords
		};

		Move<VkSampler>			tmpSampler	= createSampler(vk, vkDevice, &samplerInfo);
		Move<VkSampler>			tmp2Sampler;

		tmp2Sampler = tmpSampler;

		const Unique<VkSampler>	sampler		(tmp2Sampler);
	}

	return tcu::TestStatus::pass("Creating sampler succeeded");
}